

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void osgen_gridwin_resize(osgen_gridwin_t *win,size_t new_wid,size_t new_ht)

{
  char *pcVar1;
  osgen_charcolor_t *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __n;
  char *__src;
  char *txtp;
  osgen_charcolor_t *colorp;
  osgen_charcolor_t *__src_00;
  
  __n = win->grid_wid;
  uVar4 = win->grid_ht;
  if (uVar4 < new_ht || __n < new_wid) {
    if (new_wid < __n) {
      new_wid = __n;
    }
    if (new_ht < uVar4) {
      new_ht = uVar4;
    }
    pcVar1 = (char *)malloc(new_ht * new_wid);
    poVar2 = (osgen_charcolor_t *)malloc(new_ht * new_wid * 2);
    __src = win->grid_txt;
    __src_00 = win->grid_color;
    txtp = pcVar1;
    colorp = poVar2;
    for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      memcpy(txtp,__src,__n);
      memcpy(colorp,__src_00,__n * 2);
      osgen_gridwin_clear_ptr(txtp + __n,colorp + __n,new_wid - __n);
      __n = win->grid_wid;
      uVar4 = win->grid_ht;
      __src = __src + __n;
      __src_00 = __src_00 + __n;
      txtp = txtp + new_wid;
      colorp = colorp + new_wid;
    }
    for (; uVar3 < new_ht; uVar3 = uVar3 + 1) {
      osgen_gridwin_clear_ptr(txtp,colorp,new_wid);
      txtp = txtp + new_wid;
      colorp = colorp + new_wid;
    }
    free(win->grid_txt);
    free(win->grid_color);
    win->grid_txt = pcVar1;
    win->grid_color = poVar2;
    win->grid_wid = new_wid;
    win->grid_ht = new_ht;
  }
  return;
}

Assistant:

static void osgen_gridwin_resize(osgen_gridwin_t *win,
                                 size_t new_wid, size_t new_ht)
{
    /* if the window's size is now bigger than the grid, expand the grid */
    if (new_wid > win->grid_wid || new_ht > win->grid_ht)
    {
        char *new_txt;
        osgen_charcolor_t *new_color;
        char *tsrc, *tdst;
        osgen_charcolor_t *csrc, *cdst;
        size_t y;

        /*  
         *   use the larger of the old size and the new size, so that the
         *   window only expands (this somewhat simplifies copying the old
         *   to the new) 
         */
        if (win->grid_wid > new_wid)
            new_wid = win->grid_wid;
        if (win->grid_ht > new_ht)
            new_ht = win->grid_ht;

        /* allocate the new arrays */
        new_txt = (char *)osmalloc(new_wid * new_ht);
        new_color = (osgen_charcolor_t *)osmalloc(
            new_wid * new_ht * sizeof(new_color[0]));

        /* copy the old grid to the new grid */
        tsrc = win->grid_txt;
        csrc = win->grid_color;
        tdst = new_txt;
        cdst = new_color;
        for (y = 0 ; y < win->grid_ht ; ++y)
        {
            /* copy the old text and color data */
            memcpy(tdst, tsrc, win->grid_wid);
            memcpy(cdst, csrc, win->grid_wid * sizeof(cdst[0]));

            /* clear the rest of the line if expanding the width */
            osgen_gridwin_clear_ptr(tdst + win->grid_wid,
                                    cdst + win->grid_wid,
                                    new_wid - win->grid_wid);

            /* advance the pointers */
            tsrc += win->grid_wid;
            csrc += win->grid_wid;
            tdst += new_wid;
            cdst += new_wid;
        }

        /* clear all remaining lines */
        for ( ; y < new_ht ; ++y, tdst += new_wid, cdst += new_wid)
            osgen_gridwin_clear_ptr(tdst, cdst, new_wid);

        /* delete the old buffers */
        osfree(win->grid_txt);
        osfree(win->grid_color);

        /* set the new buffers and sizes */
        win->grid_txt = new_txt;
        win->grid_color = new_color;
        win->grid_wid = new_wid;
        win->grid_ht = new_ht;
    }
}